

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O3

bool cppcms::encoding::windows_1258_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  size_t sVar2;
  
  if (p != e) {
    sVar2 = *count;
    do {
      sVar2 = sVar2 + 1;
      *count = sVar2;
      bVar1 = *p;
      if (((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) &&
         (((bVar1 < 0x20 || (bVar1 == 0x7f)) ||
          (((byte)(bVar1 + 0x7f) < 0x1e && ((0x3200f201U >> ((byte)(bVar1 + 0x7f) & 0x1f) & 1) != 0)
           ))))) {
        return false;
      }
      p = (char *)((byte *)p + 1);
    } while (p != e);
  }
  return true;
}

Assistant:

bool windows_1258_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || c==0x7F)
				return false;
			switch(c) {
			case 0x81:
			case 0x8A:
			case 0x8D:
			case 0x8E:
			case 0x8F:
			case 0x90:
			case 0x9A:
			case 0x9D:
			case 0x9E:
				return false;
			}
		}
		return true;
	}